

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryTestsUtil.cpp
# Opt level: O3

GraphicsPipelineBuilder * __thiscall
vkt::geometry::GraphicsPipelineBuilder::setVertexInputSingleAttribute
          (GraphicsPipelineBuilder *this,VkFormat vertexFormat,deUint32 stride)

{
  pointer *ppVVar1;
  pointer *ppVVar2;
  VkVertexInputBindingDescription *pVVar3;
  VkVertexInputAttributeDescription *pVVar4;
  iterator __position;
  iterator __position_00;
  VkVertexInputBindingDescription bindingDesc;
  VkVertexInputAttributeDescription attributeDesc;
  VkVertexInputBindingDescription local_24;
  VkVertexInputAttributeDescription local_18;
  
  local_24.binding = 0;
  local_24.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_18.location = 0;
  local_18.binding = 0;
  local_18.offset = 0;
  pVVar3 = (this->m_vertexInputBindings).
           super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_vertexInputBindings).
       super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != pVVar3) {
    (this->m_vertexInputBindings).
    super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar3;
    __position._M_current = pVVar3;
  }
  local_24.stride = stride;
  local_18.format = vertexFormat;
  if (__position._M_current ==
      (this->m_vertexInputBindings).
      super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vk::VkVertexInputBindingDescription,std::allocator<vk::VkVertexInputBindingDescription>>
    ::_M_realloc_insert<vk::VkVertexInputBindingDescription_const&>
              ((vector<vk::VkVertexInputBindingDescription,std::allocator<vk::VkVertexInputBindingDescription>>
                *)&this->m_vertexInputBindings,__position,&local_24);
  }
  else {
    (__position._M_current)->inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
    (__position._M_current)->binding = (int)((ulong)stride << 0x20);
    (__position._M_current)->stride = (int)(((ulong)stride << 0x20) >> 0x20);
    ppVVar1 = &(this->m_vertexInputBindings).
               super__Vector_base<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  pVVar4 = (this->m_vertexInputAttributes).
           super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position_00._M_current =
       (this->m_vertexInputAttributes).
       super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current != pVVar4) {
    (this->m_vertexInputAttributes).
    super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar4;
    __position_00._M_current = pVVar4;
  }
  if (__position_00._M_current ==
      (this->m_vertexInputAttributes).
      super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
    ::_M_realloc_insert<vk::VkVertexInputAttributeDescription_const&>
              ((vector<vk::VkVertexInputAttributeDescription,std::allocator<vk::VkVertexInputAttributeDescription>>
                *)&this->m_vertexInputAttributes,__position_00,&local_18);
  }
  else {
    (__position_00._M_current)->location = local_18.location;
    (__position_00._M_current)->binding = local_18.binding;
    (__position_00._M_current)->format = local_18.format;
    (__position_00._M_current)->offset = local_18.offset;
    ppVVar2 = &(this->m_vertexInputAttributes).
               super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar2 = *ppVVar2 + 1;
  }
  return this;
}

Assistant:

GraphicsPipelineBuilder& GraphicsPipelineBuilder::setVertexInputSingleAttribute (const VkFormat vertexFormat, const deUint32 stride)
{
	const VkVertexInputBindingDescription bindingDesc =
	{
		0u,									// uint32_t				binding;
		stride,								// uint32_t				stride;
		VK_VERTEX_INPUT_RATE_VERTEX,		// VkVertexInputRate	inputRate;
	};
	const VkVertexInputAttributeDescription attributeDesc =
	{
		0u,									// uint32_t			location;
		0u,									// uint32_t			binding;
		vertexFormat,						// VkFormat			format;
		0u,									// uint32_t			offset;
	};

	m_vertexInputBindings.clear();
	m_vertexInputBindings.push_back(bindingDesc);

	m_vertexInputAttributes.clear();
	m_vertexInputAttributes.push_back(attributeDesc);

	return *this;
}